

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

void __thiscall
QSinglePointEvent::QSinglePointEvent
          (QSinglePointEvent *this,Type type,QPointingDevice *dev,QEventPoint *point,
          MouseButton button,MouseButtons buttons,KeyboardModifiers modifiers,
          MouseEventSource source)

{
  undefined1 *puVar1;
  QList<QEventPoint> *this_00;
  
  QEvent::QEvent((QEvent *)this,type);
  puVar1 = &(this->super_QPointerEvent).super_QInputEvent.field_0xf;
  *puVar1 = *puVar1 | 0xe0;
  (this->super_QPointerEvent).super_QInputEvent.m_dev = &dev->super_QInputDevice;
  (this->super_QPointerEvent).super_QInputEvent.m_timeStamp = 0;
  (this->super_QPointerEvent).super_QInputEvent.m_modState.
  super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (Int)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
            super_QFlagsStorage<Qt::KeyboardModifier>.i;
  this_00 = &(this->super_QPointerEvent).m_points;
  (this->super_QPointerEvent).m_points.d.ptr = (QEventPoint *)0x0;
  (this->super_QPointerEvent).m_points.d.size = 0;
  *(undefined8 *)&(this->super_QPointerEvent).super_QInputEvent.m_reserved = 0;
  *(undefined8 *)((long)&(this->super_QPointerEvent).m_points.d.d + 4) = 0;
  *(undefined ***)&(this->super_QPointerEvent).super_QInputEvent = &PTR__QHoverEvent_007e4088;
  this->m_button = button;
  (this->m_mouseState).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
  super_QFlagsStorage<Qt::MouseButton>.i =
       (Int)buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
            super_QFlagsStorage<Qt::MouseButton>.i;
  this->m_source = source;
  *(undefined4 *)&this->m_reserved = 0;
  QtPrivate::QMovableArrayOps<QEventPoint>::emplace<QEventPoint_const&>
            ((QMovableArrayOps<QEventPoint> *)this_00,(this->super_QPointerEvent).m_points.d.size,
             point);
  QList<QEventPoint>::end(this_00);
  return;
}

Assistant:

QSinglePointEvent::QSinglePointEvent(QEvent::Type type, const QPointingDevice *dev, const QEventPoint &point,
                                     Qt::MouseButton button, Qt::MouseButtons buttons,
                                     Qt::KeyboardModifiers modifiers, Qt::MouseEventSource source)
    : QPointerEvent(type, QEvent::SinglePointEventTag{}, dev, modifiers),
      m_button(button),
      m_mouseState(buttons),
      m_source(source),
      m_reserved(0), m_reserved2(0),
      m_doubleClick(false), m_phase(0), m_invertedScrolling(0)
{
    m_points << point;
}